

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_dr_wav_s24_to_f32(float *pOut,ma_uint8 *pIn,size_t sampleCount)

{
  ma_uint32 c;
  ma_uint32 b;
  ma_uint32 a;
  double x;
  size_t i;
  size_t sampleCount_local;
  ma_uint8 *pIn_local;
  float *pOut_local;
  
  if ((pOut != (float *)0x0) && (pIn != (ma_uint8 *)0x0)) {
    pOut_local = pOut;
    for (i = 0; i < sampleCount; i = i + 1) {
      *pOut_local = (float)((int)((uint)pIn[i * 3] << 8 | (uint)pIn[i * 3 + 1] << 0x10 |
                                 (uint)pIn[i * 3 + 2] << 0x18) >> 8) * 1.1920929e-07;
      pOut_local = pOut_local + 1;
    }
  }
  return;
}

Assistant:

MA_API void ma_dr_wav_s24_to_f32(float* pOut, const ma_uint8* pIn, size_t sampleCount)
{
    size_t i;
    if (pOut == NULL || pIn == NULL) {
        return;
    }
    for (i = 0; i < sampleCount; ++i) {
        double x;
        ma_uint32 a = ((ma_uint32)(pIn[i*3+0]) <<  8);
        ma_uint32 b = ((ma_uint32)(pIn[i*3+1]) << 16);
        ma_uint32 c = ((ma_uint32)(pIn[i*3+2]) << 24);
        x = (double)((ma_int32)(a | b | c) >> 8);
        *pOut++ = (float)(x * 0.00000011920928955078125);
    }
}